

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<double>::UpdateFrom
          (TPZSkylMatrix<double> *this,TPZAutoPointer<TPZMatrix<double>_> *mat)

{
  TPZMatrix<double> *pTVar1;
  long lVar2;
  
  pTVar1 = mat->fRef->fPointer;
  if (pTVar1 == (TPZMatrix<double> *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(pTVar1,&TPZMatrix<double>::typeinfo,&typeinfo,0);
  }
  if (lVar2 == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0x70);
  }
  if ((this->fStorage).fNElements != *(long *)(lVar2 + 0x50)) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0x73);
  }
  memcpy((this->fStorage).fStore,*(void **)(lVar2 + 0x48),(this->fStorage).fNElements << 3);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = *(char *)(lVar2 + 0x18);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = *(char *)(lVar2 + 0x19);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
    TPZMatrix<TVar> *matrix = mat.operator->();
    TPZSkylMatrix<TVar> *skylmat = dynamic_cast<TPZSkylMatrix<TVar> *>(matrix);
    if (!skylmat) {
        DebugStop();
    }
    if (fStorage.NElements() != skylmat->fStorage.NElements()) {
        DebugStop();
    }
    memcpy(&fStorage[0], &(skylmat->fStorage[0]) , fStorage.NElements()*sizeof(TVar));
    this->fDecomposed = skylmat->fDecomposed;
    this->fDefPositive = skylmat->fDefPositive;
}